

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::WriteGroups
          (cmExtraEclipseCDT4Generator *this,
          vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups,string *linkName,
          cmXMLWriter *xml)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  size_type sVar4;
  pointer ppcVar5;
  cmSourceGroup *pcVar6;
  bool bVar7;
  string *psVar8;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *sourceGroups_00;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer pcVar9;
  pointer this_00;
  pointer ppcVar10;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string linkName3;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string linkName4;
  string local_128;
  size_type local_108;
  pointer local_100;
  string *local_f8;
  string local_f0;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> local_d0;
  string local_b8;
  cmExtraEclipseCDT4Generator *local_98;
  pointer local_90;
  cmSourceGroup *local_88;
  string local_80;
  size_type local_60;
  undefined1 *puStack_58;
  undefined1 local_50 [32];
  
  this_00 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_90 = (sourceGroups->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != local_90) {
    paVar1 = &local_128.field_2;
    local_f8 = linkName;
    local_98 = this;
    do {
      pcVar9 = (local_f8->_M_dataplus)._M_p;
      pcVar2 = (pointer)local_f8->_M_string_length;
      local_60 = 1;
      puStack_58 = local_50;
      local_50[0] = 0x2f;
      psVar8 = cmSourceGroup::GetFullName_abi_cxx11_(this_00);
      local_128.field_2._M_allocated_capacity = local_60;
      local_128.field_2._8_8_ = puStack_58;
      local_100 = (psVar8->_M_dataplus)._M_p;
      local_108 = psVar8->_M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)&local_128;
      local_128._M_dataplus._M_p = pcVar2;
      local_128._M_string_length = (size_type)pcVar9;
      cmCatViews_abi_cxx11_(&local_f0,views);
      if ((pointer)local_f0._M_string_length != (pointer)0x0) {
        pcVar9 = (pointer)0x0;
        do {
          if (local_f0._M_dataplus._M_p[(long)pcVar9] == '\\') {
            local_f0._M_dataplus._M_p[(long)pcVar9] = '/';
          }
          pcVar9 = pcVar9 + 1;
        } while ((pointer)local_f0._M_string_length != pcVar9);
      }
      local_128._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"virtual:/virtual","");
      AppendLinkedResource(xml,&local_f0,&local_128,VirtualFolder);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != paVar1) {
        operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
      }
      sourceGroups_00 = cmSourceGroup::GetGroupChildren(this_00);
      if ((sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (sourceGroups_00->super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        WriteGroups(local_98,sourceGroups_00,local_f8,xml);
      }
      local_88 = this_00;
      __x = cmSourceGroup::GetSourceFiles(this_00);
      std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                (&local_d0,__x);
      ppcVar5 = local_d0.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar10 = local_d0.
                      super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppcVar10 != ppcVar5;
          ppcVar10 = ppcVar10 + 1) {
        psVar8 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar10);
        bVar7 = cmsys::SystemTools::FileIsDirectory(psVar8);
        sVar4 = local_f0._M_string_length;
        _Var3._M_p = local_f0._M_dataplus._M_p;
        if (!bVar7) {
          local_60 = 1;
          puStack_58 = local_50;
          local_50[0] = 0x2f;
          cmsys::SystemTools::GetFilenameName(&local_b8,psVar8);
          local_128._M_dataplus._M_p = (pointer)sVar4;
          local_128._M_string_length = (size_type)_Var3._M_p;
          local_128.field_2._M_allocated_capacity = local_60;
          local_128.field_2._8_8_ = puStack_58;
          local_108 = local_b8._M_string_length;
          local_100 = local_b8._M_dataplus._M_p;
          views_00._M_len = 3;
          views_00._M_array = (iterator)&local_128;
          cmCatViews_abi_cxx11_(&local_80,views_00);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          pcVar9 = (psVar8->_M_dataplus)._M_p;
          local_128._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,pcVar9,pcVar9 + psVar8->_M_string_length);
          AppendLinkedResource(xml,&local_80,&local_128,LinkToFile);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != paVar1) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
      }
      if (local_d0.super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_d0.
                        super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_d0.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_d0.
                              super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pcVar6 = local_88;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      this_00 = pcVar6 + 1;
    } while (this_00 != local_90);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::WriteGroups(
  std::vector<cmSourceGroup> const& sourceGroups, std::string& linkName,
  cmXMLWriter& xml)
{
  for (cmSourceGroup const& sg : sourceGroups) {
    std::string linkName3 = cmStrCat(linkName, '/', sg.GetFullName());

    std::replace(linkName3.begin(), linkName3.end(), '\\', '/');

    cmExtraEclipseCDT4Generator::AppendLinkedResource(
      xml, linkName3, "virtual:/virtual", VirtualFolder);
    std::vector<cmSourceGroup> const& children = sg.GetGroupChildren();
    if (!children.empty()) {
      this->WriteGroups(children, linkName, xml);
    }
    std::vector<const cmSourceFile*> sFiles = sg.GetSourceFiles();
    for (cmSourceFile const* file : sFiles) {
      std::string const& fullPath = file->GetFullPath();

      if (!cmSystemTools::FileIsDirectory(fullPath)) {
        std::string linkName4 =
          cmStrCat(linkName3, '/', cmSystemTools::GetFilenameName(fullPath));
        cmExtraEclipseCDT4Generator::AppendLinkedResource(
          xml, linkName4,
          cmExtraEclipseCDT4Generator::GetEclipsePath(fullPath), LinkToFile);
      }
    }
  }
}